

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O2

void nn_surveyor_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  nn_surveyor *self_00;
  undefined8 uVar4;
  
  self_00 = (nn_surveyor *)&self[-5].shutdown_fn;
  if (self == (nn_fsm *)0x0) {
    self_00 = (nn_surveyor *)0x0;
  }
  uVar3 = (ulong)(uint)src;
  switch(self_00->state) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_0011cd15:
        self_00->state = 2;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x169;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x16d;
    }
    break;
  case 2:
    if (src == -2) {
      if (type == 1) {
LAB_0011cd58:
        nn_surveyor_resend(self_00);
        nn_timer_start(&self_00->timer,self_00->deadline);
        self_00->state = 3;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x180;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x184;
    }
    break;
  case 3:
    if (src == 1) {
      if (type == 1) {
        nn_timer_stop(&self_00->timer);
        self_00->state = 5;
        self_00->timedout = 1;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x1a0;
    }
    else if (src == -2) {
      if (type == 2) {
        nn_timer_stop(&self_00->timer);
LAB_0011cc53:
        self_00->state = 4;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x195;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x1a4;
    }
    break;
  case 4:
    if (src == 1) {
      if (type == 2) goto LAB_0011cd58;
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x1bf;
    }
    else if (src == -2) {
      if (type == 2) {
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x1b4;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x1c3;
    }
    break;
  case 5:
    if (src == 1) {
      if (type == 2) goto LAB_0011cd15;
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x1dc;
    }
    else if (src == -2) {
      if (type == 2) goto LAB_0011cc53;
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x1d3;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)(uint)self_00->state;
      pcVar2 = "Unexpected source";
      uVar4 = 0x1e0;
    }
    break;
  default:
    nn_backtrace_print();
    uVar1 = (ulong)(uint)self_00->state;
    pcVar2 = "Unexpected state";
    uVar4 = 0x1e7;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,uVar1,uVar3,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/survey/surveyor.c"
          ,uVar4);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_surveyor_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, fsm);

    switch (surveyor->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The socket was created recently.                                          */
/******************************************************************************/
    case NN_SURVEYOR_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                surveyor->state = NN_SURVEYOR_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  PASSIVE state.                                                            */
/*  There's no survey going on.                                               */
/******************************************************************************/
    case NN_SURVEYOR_STATE_PASSIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_START:
                nn_surveyor_resend (surveyor);
                nn_timer_start (&surveyor->timer, surveyor->deadline);
                surveyor->state = NN_SURVEYOR_STATE_ACTIVE;
                return;

            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Survey was sent, waiting for responses.                                   */
/******************************************************************************/
    case NN_SURVEYOR_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                nn_timer_stop (&surveyor->timer);
                surveyor->state = NN_SURVEYOR_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&surveyor->timer);
                surveyor->state = NN_SURVEYOR_STATE_STOPPING_TIMER;
                surveyor->timedout = NN_SURVEYOR_TIMEDOUT;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  CANCELLING state.                                                         */
/*  Survey was cancelled, but the old timer haven't stopped yet. The new      */
/*  survey thus haven't been sent and is stored in 'tosend'.                  */
/******************************************************************************/
    case NN_SURVEYOR_STATE_CANCELLING:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_surveyor_resend (surveyor);
                nn_timer_start (&surveyor->timer, surveyor->deadline);
                surveyor->state = NN_SURVEYOR_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER state.                                                     */
/*  Survey timeout expired. Now we are stopping the timer.                    */
/******************************************************************************/
    case NN_SURVEYOR_STATE_STOPPING_TIMER:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                surveyor->state = NN_SURVEYOR_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                surveyor->state = NN_SURVEYOR_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (surveyor->state, src, type);
    }
}